

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O2

bool __thiscall
icu_63::RBBITableBuilder::findDuplicateSafeState(RBBITableBuilder *this,IntPair *states)

{
  short sVar1;
  int iVar2;
  char16_t cVar3;
  char16_t cVar4;
  int iVar5;
  UnicodeString *this_00;
  UnicodeString *this_01;
  uint uVar6;
  int index;
  int index_00;
  int32_t offset;
  int32_t iVar8;
  uint uVar7;
  
  iVar2 = this->fSafeTable->count;
  iVar5 = iVar2 + -1;
  index = states->first;
  do {
    if (iVar5 <= index) {
LAB_0029fa26:
      return index < iVar5;
    }
    this_00 = (UnicodeString *)UVector::elementAt(this->fSafeTable,index);
    uVar6 = states->first;
    uVar7 = uVar6;
LAB_0029f99a:
    index_00 = uVar7 + 1;
    states->second = index_00;
    if (index_00 < iVar2) {
      this_01 = (UnicodeString *)UVector::elementAt(this->fSafeTable,index_00);
      sVar1 = (this_00->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar8 = (this_00->fUnion).fFields.fLength;
      }
      else {
        iVar8 = (int)sVar1 >> 5;
      }
      offset = 0;
      if (iVar8 < 1) {
        iVar8 = offset;
      }
      do {
        if (iVar8 == offset) goto LAB_0029fa26;
        cVar3 = UnicodeString::doCharAt(this_00,offset);
        cVar4 = UnicodeString::doCharAt(this_01,offset);
        if (cVar3 != cVar4) {
          uVar6 = states->first;
          if (((uVar6 != (ushort)cVar3) && (uVar7 = states->second, uVar7 != (ushort)cVar3)) ||
             ((uVar6 != (ushort)cVar4 && (uVar7 = states->second, uVar7 != (ushort)cVar4))))
          goto LAB_0029f99a;
        }
        offset = offset + 1;
      } while( true );
    }
    index = uVar6 + 1;
    states->first = index;
  } while( true );
}

Assistant:

bool RBBITableBuilder::findDuplicateSafeState(IntPair *states) {
    int32_t numStates = fSafeTable->size();

    for (; states->first<numStates-1; states->first++) {
        UnicodeString *firstRow = static_cast<UnicodeString *>(fSafeTable->elementAt(states->first));
        for (states->second=states->first+1; states->second<numStates; states->second++) {
            UnicodeString *duplRow = static_cast<UnicodeString *>(fSafeTable->elementAt(states->second));
            bool rowsMatch = true;
            int32_t numCols = firstRow->length();
            for (int32_t col=0; col < numCols; ++col) {
                int32_t firstVal = firstRow->charAt(col);
                int32_t duplVal = duplRow->charAt(col);
                if (!((firstVal == duplVal) ||
                        ((firstVal == states->first || firstVal == states->second) &&
                        (duplVal  == states->first || duplVal  == states->second)))) {
                    rowsMatch = false;
                    break;
                }
            }
            if (rowsMatch) {
                return true;
            }
        }
    }
    return false;
}